

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_logic(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  long lVar1;
  TCGContext_conflict6 *tcg_ctx;
  bool bVar2;
  
  if (rd == 0) {
    return;
  }
  switch(opc) {
  case 0x24:
    if ((rs != 0) && (rt != 0)) {
      tcg_gen_op3_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_and_i64,
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rd * 2),
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rs * 2),
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rt * 2));
      return;
    }
    gen_logic_cold_1();
    return;
  case 0x25:
    if ((rs != 0) && (rt != 0)) {
      tcg_gen_op3_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_or_i64,
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rd * 2),
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rs * 2),
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rt * 2));
      return;
    }
    break;
  case 0x26:
    if ((rs != 0) && (rt != 0)) {
      tcg_gen_op3_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_xor_i64,
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rd * 2),
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rs * 2),
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rt * 2));
      return;
    }
    break;
  case 0x27:
    if (rt != 0 && rs != 0) {
      tcg_gen_nor_i64_mips64el
                ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rd * 2),
                 *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2),
                 *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2));
      return;
    }
    if (rs == 0 && rt != 0) {
      tcg_gen_not_i64_mips64el
                ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rd * 2),
                 *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2));
      return;
    }
    if (rt == 0 && rs != 0) {
      tcg_gen_not_i64_mips64el
                ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rd * 2),
                 *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2));
      return;
    }
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,
               (TCGArg)(*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rd * 2) + (long)ctx),0xffffffffffffffff)
    ;
    return;
  default:
    goto switchD_009838ee_default;
  }
  if (rs == 0 && rt != 0) {
    lVar1 = *(long *)(&ctx[0xf9].gi + (long)rd * 2);
  }
  else {
    bVar2 = rt != 0;
    lVar1 = *(long *)(&ctx[0xf9].gi + (long)rd * 2);
    rt = rs;
    if (bVar2 || rs == 0) {
      tcg_gen_op2_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_movi_i64,(long)&(ctx->base).tb + lVar1,0);
      return;
    }
  }
  if (lVar1 != *(long *)(&ctx[0xf9].gi + (long)rt * 2)) {
    tcg_gen_op2_mips64el
              ((TCGContext_conflict6 *)ctx,INDEX_op_mov_i64,(long)&(ctx->base).tb + lVar1,
               (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (long)rt * 2));
    return;
  }
switchD_009838ee_default:
  return;
}

Assistant:

static void gen_logic(DisasContext *ctx, uint32_t opc,
                      int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    switch (opc) {
    case OPC_AND:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_and_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_NOR:
        if (rs != 0 && rt != 0) {
            tcg_gen_nor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_not_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], ~((target_ulong)0));
        }
        break;
    case OPC_OR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    case OPC_XOR:
        if (likely(rs != 0 && rt != 0)) {
            tcg_gen_xor_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs], tcg_ctx->cpu_gpr[rt]);
        } else if (rs == 0 && rt != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rt]);
        } else if (rs != 0 && rt == 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], tcg_ctx->cpu_gpr[rs]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], 0);
        }
        break;
    }
}